

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-path.c
# Opt level: O0

void clone_traverse_func(void *closure,plutovg_path_command_t command,plutovg_point_t *points,
                        int npoints)

{
  plutovg_path_t *path;
  int npoints_local;
  plutovg_point_t *points_local;
  plutovg_path_command_t command_local;
  void *closure_local;
  
  switch(command) {
  case PLUTOVG_PATH_COMMAND_MOVE_TO:
    plutovg_path_move_to((plutovg_path_t *)closure,points->x,points->y);
    break;
  case PLUTOVG_PATH_COMMAND_LINE_TO:
    plutovg_path_line_to((plutovg_path_t *)closure,points->x,points->y);
    break;
  case PLUTOVG_PATH_COMMAND_CUBIC_TO:
    plutovg_path_cubic_to
              ((plutovg_path_t *)closure,points->x,points->y,points[1].x,points[1].y,points[2].x,
               points[2].y);
    break;
  case PLUTOVG_PATH_COMMAND_CLOSE:
    plutovg_path_close((plutovg_path_t *)closure);
  }
  return;
}

Assistant:

static void clone_traverse_func(void* closure, plutovg_path_command_t command, const plutovg_point_t* points, int npoints)
{
    plutovg_path_t* path = (plutovg_path_t*)(closure);
    switch(command) {
    case PLUTOVG_PATH_COMMAND_MOVE_TO:
        plutovg_path_move_to(path, points[0].x, points[0].y);
        break;
    case PLUTOVG_PATH_COMMAND_LINE_TO:
        plutovg_path_line_to(path, points[0].x, points[0].y);
        break;
    case PLUTOVG_PATH_COMMAND_CUBIC_TO:
        plutovg_path_cubic_to(path, points[0].x, points[0].y, points[1].x, points[1].y, points[2].x, points[2].y);
        break;
    case PLUTOVG_PATH_COMMAND_CLOSE:
        plutovg_path_close(path);
        break;
    }
}